

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

char * Strsafe(char *y)

{
  uint uVar1;
  char *__s;
  FILE *__dest;
  size_t sVar2;
  char *extraout_RAX;
  char *extraout_RAX_00;
  char *pcVar3;
  uint *in_RCX;
  long extraout_RDX;
  uint uVar4;
  char *in_RSI;
  FILE *__stream;
  
  if (y == (char *)0x0) {
    __dest = (FILE *)0x0;
  }
  else {
    __stream = (FILE *)y;
    __dest = (FILE *)Strsafe_find(y);
    if (__dest == (FILE *)0x0) {
      sVar2 = strlen(y);
      __stream = (FILE *)(long)((int)sVar2 + 1);
      __dest = (FILE *)malloc((size_t)__stream);
      if (__dest == (FILE *)0x0) {
        __dest = (FILE *)0x0;
      }
      else {
        strcpy((char *)__dest,y);
        __stream = __dest;
        Strsafe_insert((char *)__dest);
        in_RSI = y;
      }
    }
    if (__dest == (FILE *)0x0) {
      Strsafe_cold_1();
      pcVar3 = extraout_RAX;
      if ((*(char **)(in_RSI + 0x40) != (char *)0x0) && (**(char **)(in_RSI + 0x40) != '\0')) {
        fprintf(__stream,"{%s");
        pcVar3 = *(char **)(in_RSI + 0x40);
        do {
          if (*pcVar3 == '\n') {
            *in_RCX = *in_RCX + 1;
          }
          else if (*pcVar3 == '\0') break;
          pcVar3 = pcVar3 + 1;
        } while( true );
      }
      if (*(long *)(in_RSI + 0x38) != 0) {
        if (*(int *)(extraout_RDX + 0xf4) == 0) {
          *in_RCX = *in_RCX + 1;
          tplt_linedir((FILE *)__stream,*(int *)(in_RSI + 0x30),*(char **)(extraout_RDX + 0xc0));
        }
        fprintf(__stream,"{%s",*(undefined8 *)(in_RSI + 0x38));
        pcVar3 = *(char **)(in_RSI + 0x38);
        do {
          if (*pcVar3 == '\n') {
            *in_RCX = *in_RCX + 1;
          }
          else if (*pcVar3 == '\0') goto LAB_0010b761;
          pcVar3 = pcVar3 + 1;
        } while( true );
      }
      goto LAB_0010b7a1;
    }
  }
  return (char *)__dest;
LAB_0010b761:
  fwrite("}\n",2,1,__stream);
  uVar4 = *in_RCX;
  uVar1 = uVar4 + 1;
  pcVar3 = (char *)(ulong)uVar1;
  *in_RCX = uVar1;
  if (*(int *)(extraout_RDX + 0xf4) == 0) {
    uVar4 = uVar4 + 2;
    *in_RCX = uVar4;
    tplt_linedir((FILE *)__stream,uVar4,*(char **)(extraout_RDX + 0xd0));
    pcVar3 = extraout_RAX_00;
  }
LAB_0010b7a1:
  __s = *(char **)(in_RSI + 0x48);
  if ((__s != (char *)0x0) && (*__s != '\0')) {
    fputs(__s,__stream);
    pcVar3 = *(char **)(in_RSI + 0x48);
    do {
      if (*pcVar3 == '\n') {
        *in_RCX = *in_RCX + 1;
      }
      else if (*pcVar3 == '\0') break;
      pcVar3 = pcVar3 + 1;
    } while( true );
  }
  if (*(long *)(in_RSI + 0x40) != 0) {
    pcVar3 = (char *)fwrite("}\n",2,1,__stream);
    *in_RCX = *in_RCX + 1;
  }
  return pcVar3;
}

Assistant:

const char *Strsafe(const char *y)
{
  const char *z;
  char *cpy;

  if( y==0 ) return 0;
  z = Strsafe_find(y);
  if( z==0 && (cpy=(char *)malloc( lemonStrlen(y)+1 ))!=0 ){
    strcpy(cpy,y);
    z = cpy;
    Strsafe_insert(z);
  }
  MemoryCheck(z);
  return z;
}